

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps_test.cc
# Opt level: O0

void __thiscall MissingDependencyScannerTest::CreateInitialState(MissingDependencyScannerTest *this)

{
  Edge *pEVar1;
  StringPiece local_c8;
  Edge *local_b8;
  Edge *compile_edge;
  Edge *local_a0;
  Edge *header_edge;
  string local_90;
  allocator<char> local_69;
  string local_68;
  StringPiece local_38;
  undefined1 local_28 [8];
  EvalString deps_type;
  MissingDependencyScannerTest *this_local;
  
  deps_type.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  EvalString::EvalString((EvalString *)local_28);
  StringPiece::StringPiece(&local_38,"gcc");
  EvalString::AddText((EvalString *)local_28,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"deps",&local_69);
  Rule::AddBinding(&this->compile_rule_,&local_68,(EvalString *)local_28);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"deps",(allocator<char> *)((long)&header_edge + 7));
  Rule::AddBinding(&this->generator_rule_,&local_90,(EvalString *)local_28);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)((long)&header_edge + 7));
  pEVar1 = State::AddEdge(&this->state_,&this->generator_rule_);
  local_a0 = pEVar1;
  StringPiece::StringPiece((StringPiece *)&compile_edge,"generated_header");
  State::AddOut(&this->state_,pEVar1,_compile_edge,0);
  pEVar1 = State::AddEdge(&this->state_,&this->compile_rule_);
  local_b8 = pEVar1;
  StringPiece::StringPiece(&local_c8,"compiled_object");
  State::AddOut(&this->state_,pEVar1,local_c8,0);
  EvalString::~EvalString((EvalString *)local_28);
  return;
}

Assistant:

void CreateInitialState() {
    EvalString deps_type;
    deps_type.AddText("gcc");
    compile_rule_.AddBinding("deps", deps_type);
    generator_rule_.AddBinding("deps", deps_type);
    Edge* header_edge = state_.AddEdge(&generator_rule_);
    state_.AddOut(header_edge, "generated_header", 0);
    Edge* compile_edge = state_.AddEdge(&compile_rule_);
    state_.AddOut(compile_edge, "compiled_object", 0);
  }